

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O3

string * expandEsiStr(string *esiStr)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  istream *piVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  uint __len;
  uint __val;
  string __str;
  string num;
  istringstream ss1;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0;
  ulong local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)esiStr,_S_in);
  local_1d0 = (long *)&local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  std::__cxx11::string::_M_replace((ulong)esiStr,0,(char *)esiStr->_M_string_length,0x104371);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_1d0,',');
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    lVar6 = std::__cxx11::string::find_last_not_of((char *)&local_1d0,0x104004,0xffffffffffffffff);
    uVar7 = lVar6 + 1;
    if (local_1c8 < uVar7) goto LAB_00102c28;
    *(undefined1 *)((long)local_1d0 + uVar7) = 0;
    local_1c8 = uVar7;
    std::__cxx11::string::find_first_not_of((char *)&local_1d0,0x104004,0);
    std::__cxx11::string::erase((ulong)&local_1d0,0);
    std::__cxx11::string::_M_assign((string *)&local_1d0);
    lVar6 = std::__cxx11::string::find_first_of((char *)&local_1d0,0x10400b,0);
    plVar2 = local_1d0;
    if (lVar6 == -1) {
      std::__cxx11::string::_M_append((char *)esiStr,(ulong)local_1d0);
      std::__cxx11::string::append((char *)esiStr);
    }
    else {
      piVar8 = __errno_location();
      iVar1 = *piVar8;
      *piVar8 = 0;
      uVar7 = strtol((char *)plVar2,(char **)local_1f0,10);
      if (local_1f0[0] == plVar2) goto LAB_00102c4c;
      if ((uVar7 - 0x80000000 < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00102c40;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)&local_1d0);
      std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_1f0);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      std::__cxx11::string::find_first_not_of((char *)&local_1d0,0x10400b,0);
      std::__cxx11::string::erase((ulong)&local_1d0,0);
      plVar2 = local_1d0;
      iVar1 = *piVar8;
      *piVar8 = 0;
      lVar6 = strtol((char *)local_1d0,(char **)local_1f0,10);
      if (local_1f0[0] == plVar2) goto LAB_00102c58;
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00102c64;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      if ((int)uVar7 <= (int)(uint)lVar6) {
        do {
          uVar11 = (uint)uVar7;
          __val = -uVar11;
          if (0 < (int)uVar11) {
            __val = uVar11;
          }
          __len = 1;
          if (9 < __val) {
            uVar10 = (ulong)__val;
            uVar3 = 4;
            do {
              __len = uVar3;
              uVar4 = (uint)uVar10;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_00102ae5;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_00102ae5;
              }
              if (uVar4 < 10000) goto LAB_00102ae5;
              uVar10 = uVar10 / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar4);
            __len = __len + 1;
          }
LAB_00102ae5:
          local_1f0[0] = local_1e0;
          std::__cxx11::string::_M_construct
                    ((ulong)local_1f0,(char)__len - ((char)(uVar7 >> 0x18) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_1f0[0] + (ulong)(uVar11 >> 0x1f)),__len,__val);
          std::__cxx11::string::_M_append((char *)esiStr,(ulong)local_1f0[0]);
          if (local_1f0[0] != local_1e0) {
            operator_delete(local_1f0[0],local_1e0[0] + 1);
          }
          std::__cxx11::string::append((char *)esiStr);
          uVar7 = (ulong)(uVar11 + 1);
        } while (uVar11 != (uint)lVar6);
      }
    }
  }
  lVar6 = std::__cxx11::string::find_last_not_of((char *)esiStr,0x10400d,0xffffffffffffffff);
  uVar7 = lVar6 + 1;
  if (uVar7 <= esiStr->_M_string_length) {
    esiStr->_M_string_length = uVar7;
    (esiStr->_M_dataplus)._M_p[uVar7] = '\0';
    std::__cxx11::string::_M_assign((string *)esiStr);
    if (local_1d0 != (long *)&local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    return esiStr;
  }
LAB_00102c28:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar7);
LAB_00102c40:
  std::__throw_out_of_range("stoi");
LAB_00102c4c:
  std::__throw_invalid_argument("stoi");
LAB_00102c58:
  std::__throw_invalid_argument("stoi");
LAB_00102c64:
  uVar9 = std::__throw_out_of_range("stoi");
  if (local_1d0 != (long *)&local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  _Unwind_Resume(uVar9);
}

Assistant:

string& expandEsiStr (string& esiStr) {

    istringstream ss1(esiStr);
    string num;
    esiStr = "";

    int i = 0;

    /* Look at all comma separated ESIs or ESI ranges */
    while (getline(ss1, num, ',')) {

        /* Remove whitespace if any */
        num = trim(num);

        /* Check if its a range */
        std::size_t found = num.find_first_of("-");

        /* If it is a range find start and end of range and enumerate the ESIs
           and append to ESI string */
        if (found!=std::string::npos) {

            std::string::size_type sz;
            int startR = std::stoi (num,&sz);
            num = num.substr(sz);
            num.erase(0, num.find_first_not_of("-"));
            int endR = std::stoi(num,&sz);

            for (int i = startR; i <= endR; i++)
                {
                    esiStr.append(to_string(i));
                    esiStr.append(",");
                }
        }
        /* If it is not a range, append ESI to ESI string */
        else {
            esiStr.append(num);
            esiStr.append(",");
        }
        i++;
    }

    /* Remove trailing comma */
    esiStr = rtrim(esiStr, ",");

    return esiStr;
}